

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O0

shared_ptr<mocker::nasm::Extern>
mocker::nasm::dyc<mocker::nasm::Extern,std::shared_ptr<mocker::nasm::Directive>const&>
          (shared_ptr<mocker::nasm::Directive> *v)

{
  shared_ptr<mocker::nasm::Extern> sVar1;
  shared_ptr<mocker::nasm::Directive> *v_local;
  
  sVar1 = std::dynamic_pointer_cast<mocker::nasm::Extern,mocker::nasm::Directive>(v);
  sVar1.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)v;
  return (shared_ptr<mocker::nasm::Extern>)
         sVar1.super___shared_ptr<mocker::nasm::Extern,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc(V &&v) {
  return std::dynamic_pointer_cast<T>(v);
}